

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O2

shared_ptr<evp_pkey_st> __thiscall
jwt::helper::load_private_key_from_string(helper *this,string *key,string *password)

{
  int len;
  int iVar1;
  BIO_METHOD *type;
  BIO *b;
  EVP_PKEY *__p;
  rsa_exception *prVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<evp_pkey_st> sVar3;
  unique_ptr<bio_st,_void_(*)(bio_st_*)> privkey_bio;
  
  type = BIO_s_mem();
  b = BIO_new(type);
  privkey_bio._M_t.super___uniq_ptr_impl<bio_st,_void_(*)(bio_st_*)>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_void_(*)(bio_st_*)>.super__Tuple_impl<1UL,_void_(*)(bio_st_*)>.
  super__Head_base<1UL,_void_(*)(bio_st_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(bio_st_*),_false>)BIO_free_all;
  len = (int)key->_M_string_length;
  privkey_bio._M_t.super___uniq_ptr_impl<bio_st,_void_(*)(bio_st_*)>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_void_(*)(bio_st_*)>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (bio_st *)b;
  iVar1 = BIO_write(b,(key->_M_dataplus)._M_p,len);
  if (iVar1 != len) {
    prVar2 = (rsa_exception *)__cxa_allocate_exception(0x10);
    rsa_exception::rsa_exception(prVar2,"failed to load private key: bio_write failed");
    __cxa_throw(prVar2,&rsa_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  __p = PEM_read_bio_PrivateKey(b,(EVP_PKEY **)0x0,(undefined1 *)0x0,(password->_M_dataplus)._M_p);
  std::__shared_ptr<evp_pkey_st,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<evp_pkey_st,void(*)(evp_pkey_st*),void>
            ((__shared_ptr<evp_pkey_st,(__gnu_cxx::_Lock_policy)2> *)this,(evp_pkey_st *)__p,
             EVP_PKEY_free);
  if (*(long *)this != 0) {
    std::unique_ptr<bio_st,_void_(*)(bio_st_*)>::~unique_ptr(&privkey_bio);
    sVar3.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar3.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<evp_pkey_st>)
           sVar3.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>;
  }
  prVar2 = (rsa_exception *)__cxa_allocate_exception(0x10);
  rsa_exception::rsa_exception(prVar2,"failed to load private key: PEM_read_bio_PrivateKey failed");
  __cxa_throw(prVar2,&rsa_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
		std::shared_ptr<EVP_PKEY> load_private_key_from_string(const std::string& key, const std::string& password = "") {
			std::unique_ptr<BIO, decltype(&BIO_free_all)> privkey_bio(BIO_new(BIO_s_mem()), BIO_free_all);
			const int len = static_cast<int>(key.size());
			if (BIO_write(privkey_bio.get(), key.data(), len) != len)
				throw rsa_exception("failed to load private key: bio_write failed");
			std::shared_ptr<EVP_PKEY> pkey(PEM_read_bio_PrivateKey(privkey_bio.get(), nullptr, nullptr, const_cast<char*>(password.c_str())), EVP_PKEY_free);
			if (!pkey)
				throw rsa_exception("failed to load private key: PEM_read_bio_PrivateKey failed");
			return pkey;
		}